

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O2

void CVmObjGramProd::process_work_queue
               (CVmGramProdMem *mem,vmgramprod_tok *tok,size_t tok_cnt,CVmGramProdQueue *queues,
               CVmObjDict *dict)

{
  CVmGramProdState **ppCVar1;
  int iVar2;
  CVmGramProdState *pCVar3;
  CVmGramProdState *pCVar4;
  int iVar5;
  CVmGramProdState **ppCVar6;
  CVmGramProdState *pCVar7;
  bool bVar8;
  CVmGramProdState *pCVar9;
  CVmGramProdState *pCVar10;
  
  ppCVar1 = &queues->badness_queue_;
  do {
    if (queues->work_queue_ == (CVmGramProdState *)0x0) {
      if (queues->success_list_ != (CVmGramProdMatchEntry *)0x0) {
        return;
      }
      iVar5 = 0;
      bVar8 = false;
      ppCVar6 = ppCVar1;
      while (pCVar3 = *ppCVar6, pCVar3 != (CVmGramProdState *)0x0) {
        iVar2 = pCVar3->altp_->badness;
        if (iVar2 < iVar5) {
          iVar5 = iVar2;
        }
        if (!bVar8) {
          iVar5 = iVar2;
        }
        bVar8 = true;
        ppCVar6 = &pCVar3->nxt_;
      }
      pCVar3 = *ppCVar1;
      pCVar4 = (CVmGramProdState *)0x0;
      pCVar7 = (CVmGramProdState *)0x0;
      while (pCVar10 = pCVar4, pCVar9 = pCVar3, pCVar9 != (CVmGramProdState *)0x0) {
        pCVar3 = pCVar9->nxt_;
        pCVar4 = pCVar9;
        if (pCVar9->altp_->badness == iVar5) {
          if (pCVar10 == (CVmGramProdState *)0x0) {
            *ppCVar1 = pCVar3;
          }
          else {
            pCVar10->nxt_ = pCVar3;
            pCVar7 = queues->work_queue_;
          }
          pCVar9->nxt_ = pCVar7;
          queues->work_queue_ = pCVar9;
          pCVar4 = pCVar10;
          pCVar7 = pCVar9;
        }
      }
      if (pCVar7 == (CVmGramProdState *)0x0) {
        return;
      }
    }
    process_work_queue_head(mem,tok,tok_cnt,queues,dict);
  } while( true );
}

Assistant:

void CVmObjGramProd::process_work_queue(VMG_ CVmGramProdMem *mem,
                                        const vmgramprod_tok *tok,
                                        size_t tok_cnt,
                                        CVmGramProdQueue *queues,
                                        CVmObjDict *dict)
{
    /* keep going until the work queue and badness queue are empty */
    for (;;)
    {
        /* 
         *   If the work queue is empty, fall back on the badness queue.
         *   Ignore the badness queue if we have any successful matches,
         *   since non-badness matches always take precedence over badness
         *   items. 
         */
        if (queues->work_queue_ == 0 && queues->success_list_ == 0)
        {
            int first;
            int min_badness;
            CVmGramProdState *cur;
            CVmGramProdState *prv;
            CVmGramProdState *nxt;
            
            /* find the lowest badness rating in the queue */
            for (first = TRUE, min_badness = 0, cur = queues->badness_queue_ ;
                 cur != 0 ; cur = cur->nxt_, first = FALSE)
            {
                /* 
                 *   if we're on the first item, note its badness as the
                 *   tentative minimum; otherwise, note the current item's
                 *   badness if it's lower than the lowest we've seen so
                 *   far 
                 */
                if (first || cur->altp_->badness < min_badness)
                    min_badness = cur->altp_->badness;
            }

            /* 
             *   move each of the items whose badness matches the minimum
             *   badness out of the badness queue and into the work queue 
             */
            for (cur = queues->badness_queue_, prv = 0 ; cur != 0 ;
                 cur = nxt)
            {
                /* remember the next item, in case we remove this one */
                nxt = cur->nxt_;
                
                /* if this item has minimum badness, move it */
                if (cur->altp_->badness == min_badness)
                {
                    /* unlink it from the badness queue */
                    if (prv == 0)
                        queues->badness_queue_ = cur->nxt_;
                    else
                        prv->nxt_ = cur->nxt_;

                    /* link it into the work queue */
                    cur->nxt_ = queues->work_queue_;
                    queues->work_queue_ = cur;
                }
                else
                {
                    /* 
                     *   this item is staying in the list - note it as the
                     *   item preceding the next item 
                     */
                    prv = cur;
                }
            }
        }

        /* if the work queue is still empty, we're out of work to do */
        if (queues->work_queue_ == 0)
            break;
        
        /* process the head of the work queue */
        process_work_queue_head(vmg_ mem, tok, tok_cnt, queues, dict);
    }
}